

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int * i4row_min(int m,int n,int *a)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < m) {
    uVar2 = (long)m * 4;
  }
  piVar1 = (int *)operator_new__(uVar2);
  if (0 < m) {
    uVar2 = (ulong)(uint)m;
    piVar3 = a + uVar2;
    uVar4 = 0;
    do {
      piVar1[uVar4] = a[uVar4];
      if (1 < n) {
        iVar5 = piVar1[uVar4];
        lVar6 = (ulong)(uint)n - 1;
        piVar7 = piVar3;
        do {
          if (*piVar7 < iVar5) {
            iVar5 = *piVar7;
          }
          piVar7 = piVar7 + uVar2;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        piVar1[uVar4] = iVar5;
      }
      uVar4 = uVar4 + 1;
      piVar3 = piVar3 + 1;
    } while (uVar4 != uVar2);
  }
  return piVar1;
}

Assistant:

int *i4row_min ( int m, int n, int a[] )

//****************************************************************************80
//
//  Purpose:
//
//    I4ROW_MIN returns the minimums of an I4ROW.
//
//  Example:
//
//    A =
//      1  2  3
//      2  6  7
//
//    MIN =
//      1
//      2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the array.
//
//    Input, int A[M*N], the array to be examined.
//
//    Output, int I4ROW_AMIN[M], the minimums of the rows.
//
{
  int i;
  int j;
  int *amin;

  amin = new int[m];

  for ( i = 0; i < m; i++ )
  {
    amin[i] = a[i+0*m];
    for ( j = 1; j < n; j++ )
    {
      if ( a[i+j*m] < amin[i] )
      {
        amin[i] = a[i+j*m];
      }
    }
  }

  return amin;
}